

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_default> *this)

{
  pointer puVar1;
  ulong uVar2;
  logic_error *this_00;
  int iVar3;
  pointer puVar4;
  allocator_type local_21;
  anon_class_8_1_ba1d7400 fun;
  
  if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar3 = 0x28;
    if (this->dimension_ < 0x28) {
      iVar3 = this->dimension_;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,(long)(iVar3 + 1),&local_21);
    fun.res = __return_storage_ptr__;
    for_each_simplex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension()const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int)_1_&>
              (this,&fun);
    if (this->dimension_to_be_lowered_ == true) {
      puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*puVar1 == 0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Bug in Gudhi: non-empty complex has no vertex");
LAB_0010c27a:
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      puVar4 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar2 = (long)puVar4 - (long)puVar1;
      while (puVar4 = puVar4 + -1, *puVar4 == 0) {
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = puVar4;
        uVar2 = uVar2 - 8;
      }
      this->dimension_ = (int)(uVar2 >> 3) + -1;
      this->dimension_to_be_lowered_ = false;
    }
    else if ((__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1] == 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "Bug in Gudhi: there is no simplex of dimension the dimension of the complex");
      goto LAB_0010c27a;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> num_simplices_by_dimension() const {
    if (is_empty()) return {};
    // std::min in case the upper bound got crazy
    std::vector<size_t> res(std::min(upper_bound_dimension()+1, max_dimension()+1));
    auto fun = [&res](Simplex_handle, int dim) -> void { ++res[dim]; };
    for_each_simplex(fun);
    if (dimension_to_be_lowered_) {
      GUDHI_CHECK(res.front() != 0, std::logic_error("Bug in Gudhi: non-empty complex has no vertex"));
      while (res.back() == 0) res.pop_back();
      dimension_ = static_cast<int>(res.size()) - 1;
      dimension_to_be_lowered_ = false;
    } else {
      GUDHI_CHECK(res.back() != 0,
          std::logic_error("Bug in Gudhi: there is no simplex of dimension the dimension of the complex"));
    }
    return res;
  }